

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BoardView.cpp
# Opt level: O1

void __thiscall BoardView::HandleInput(BoardView *this)

{
  KeyBindings *this_00;
  bool *pbVar1;
  float fVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  EBoardSide EVar5;
  long *plVar6;
  long lVar7;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var8;
  element_type *peVar9;
  element_type *peVar10;
  shared_ptr<Component> *psVar11;
  ImVec2 IVar12;
  undefined1 auVar13 [16];
  bool bVar14;
  undefined4 extraout_EAX;
  ImGuiIO *pIVar15;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  long lVar16;
  __normal_iterator<std::shared_ptr<Component>_*,_std::vector<std::shared_ptr<Component>,_std::allocator<std::shared_ptr<Component>_>_>_>
  _Var17;
  undefined4 extraout_var_02;
  undefined8 extraout_RAX;
  undefined4 extraout_var_03;
  shared_ptr<Component> *part_1;
  long *plVar18;
  long lVar19;
  uint8_t uVar20;
  BoardView *this_01;
  shared_ptr<Pin> *pin;
  shared_ptr<Component> *psVar21;
  SharedVector<Component> *this_02;
  shared_ptr<Component> *part;
  shared_ptr<Component> *__x;
  int iVar22;
  int iVar23;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dc_00;
  undefined4 extraout_XMM0_Dc_01;
  undefined4 extraout_XMM0_Dd;
  undefined4 extraout_XMM0_Dd_00;
  undefined4 extraout_XMM0_Dd_01;
  float fVar24;
  float fVar25;
  array<ImVec2,_4UL> poly;
  shared_ptr<Pin> selection;
  undefined1 local_b8 [4];
  float fStack_b4;
  ImVec2 IStack_b0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_a8;
  undefined1 local_98 [8];
  undefined4 uStack_90;
  undefined4 uStack_8c;
  undefined8 local_88;
  undefined4 uStack_80;
  undefined4 uStack_7c;
  element_type *local_78;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_70;
  undefined1 local_68 [16];
  SharedVector<Pin> *local_50;
  SharedVector<Component> *local_48;
  shared_ptr<Component> *local_40;
  shared_ptr<Component> *local_38;
  
  if (this->m_board == (Board *)0x0) {
    return;
  }
  if (this->m_file == (BRDFileBase *)0x0) {
    return;
  }
  pIVar15 = ImGui::GetIO();
  bVar14 = ImGui::IsWindowHovered(0);
  if (bVar14) {
    bVar14 = ImGui::IsWindowFocused(0);
    if (!bVar14) {
      ImGui::FocusWindow((ImGuiWindow *)0x0,2);
    }
    bVar14 = ImGui::IsMouseDragging(0,-1.0);
    if (bVar14) {
      if ((this->m_dragging_token == 0) &&
         (fVar25 = (this->m_board_surface).x,
         pIVar15->MouseClickedPos[0].x <= fVar25 && fVar25 != pIVar15->MouseClickedPos[0].x)) {
        this->m_dragging_token = 1;
      }
      if (this->m_dragging_token == 1) {
        IVar12 = ImGui::GetMouseDragDelta(0,-1.0);
        iVar22 = -(uint)(500.0 < ABS(IVar12.x));
        iVar23 = -(uint)(500.0 < ABS(IVar12.y));
        auVar13._4_4_ = iVar22;
        auVar13._0_4_ = iVar22;
        auVar13._8_4_ = iVar23;
        auVar13._12_4_ = iVar23;
        iVar22 = movmskpd(extraout_EAX,auVar13);
        uStack_90 = 0;
        uStack_8c = 0;
        local_98._0_4_ = 0.0;
        local_98._4_4_ = 0.0;
        if (iVar22 == 0) {
          local_98._0_4_ = IVar12.x;
          local_98._4_4_ = IVar12.y;
          uStack_90 = extraout_XMM0_Dc;
          uStack_8c = extraout_XMM0_Dd;
        }
        ImGui::ResetMouseDragDelta(0);
        IVar12 = ScreenToCoord(this,(float)local_98._0_4_,(float)local_98._4_4_,0.0);
        uVar3 = this->m_dx;
        uVar4 = this->m_dy;
        this->m_dx = (float)uVar3 + IVar12.x;
        this->m_dy = (float)uVar4 + IVar12.y;
        this->m_needsRedraw = true;
        this->m_draggingLastFrame = true;
      }
    }
    else if (-1 < this->m_dragging_token) {
      this->m_dragging_token = 0;
      if (this->m_lastFileOpenWasInvalid == false) {
        if (((this->m_file == (BRDFileBase *)0x0) || (this->m_board == (Board *)0x0)) ||
           (bVar14 = ImGui::IsMouseClicked(1,false), !bVar14)) {
          if (((this->m_lastFileOpenWasInvalid == false) && (this->m_file != (BRDFileBase *)0x0)) &&
             ((this->m_board != (Board *)0x0 && (bVar14 = ImGui::IsMouseReleased(2), bVar14)))) {
            FlipBoard(this,0);
          }
          else if (((this->m_lastFileOpenWasInvalid == false) &&
                   (this->m_file != (BRDFileBase *)0x0)) &&
                  ((this->m_board != (Board *)0x0 &&
                   ((bVar14 = ImGui::IsMouseReleased(0), bVar14 &&
                    (this->m_draggingLastFrame == false)))))) {
            IVar12 = ImGui::GetMousePos();
            IVar12 = ScreenToCoord(this,IVar12.x,IVar12.y,1.0);
            local_68._8_4_ = extraout_XMM0_Dc_01;
            local_68._0_4_ = IVar12.x;
            local_68._4_4_ = IVar12.y;
            local_68._12_4_ = extraout_XMM0_Dd_01;
            this->m_needsRedraw = true;
            iVar22 = this->m_pinDiameter;
            local_78 = (element_type *)0x0;
            _Stack_70._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
            iVar23 = (*this->m_board->_vptr_Board[4])();
            plVar18 = *(long **)CONCAT44(extraout_var,iVar23);
            plVar6 = (long *)((long *)CONCAT44(extraout_var,iVar23))[1];
            if (plVar18 != plVar6) {
              fVar25 = (float)iVar22 * 0.5;
              local_98._0_4_ = fVar25 * fVar25;
              local_88 = CONCAT44(local_68._4_4_,local_68._4_4_);
              uStack_80 = local_68._4_4_;
              uStack_7c = local_68._4_4_;
              do {
                lVar7 = *plVar18;
                p_Var8 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)plVar18[1];
                if (p_Var8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                  if (__libc_single_threaded == '\0') {
                    LOCK();
                    p_Var8->_M_use_count = p_Var8->_M_use_count + 1;
                    UNLOCK();
                  }
                  else {
                    p_Var8->_M_use_count = p_Var8->_M_use_count + 1;
                  }
                }
                if (lVar7 == 0) {
                  bVar14 = true;
                }
                else {
                  iVar22 = *(int *)(lVar7 + 8);
                  bVar14 = iVar22 == 2 || iVar22 == this->m_current_side;
                }
                if (p_Var8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var8);
                }
                if (bVar14) {
                  peVar9 = (element_type *)*plVar18;
                  fVar24 = (peVar9->position).x - (float)local_68._0_4_;
                  fVar25 = (peVar9->position).y - (float)local_88;
                  fVar25 = fVar24 * fVar24 + fVar25 * fVar25;
                  if ((fVar25 < peVar9->diameter * peVar9->diameter) &&
                     (fVar25 < (float)local_98._0_4_)) {
                    local_98._0_4_ = fVar25;
                    local_78 = peVar9;
                    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                              (&_Stack_70,
                               (__shared_count<(__gnu_cxx::_Lock_policy)2> *)(plVar18 + 1));
                  }
                }
                plVar18 = plVar18 + 2;
              } while (plVar18 != plVar6);
            }
            (this->m_pinSelected).super___shared_ptr<Pin,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                 local_78;
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                      (&(this->m_pinSelected).super___shared_ptr<Pin,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount,&_Stack_70);
            if ((this->m_pinSelected).super___shared_ptr<Pin,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
                (element_type *)0x0) {
              if (pIVar15->KeyCtrl == false) {
                iVar22 = (*this->m_board->_vptr_Board[3])();
                plVar6 = (long *)((undefined8 *)CONCAT44(extraout_var_00,iVar22))[1];
                for (plVar18 = *(long **)CONCAT44(extraout_var_00,iVar22); plVar18 != plVar6;
                    plVar18 = plVar18 + 2) {
                  lVar7 = *plVar18;
                  p_Var8 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)plVar18[1];
                  if (p_Var8 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                    *(undefined1 *)(lVar7 + 0xe0) = 0;
                  }
                  else {
                    if (__libc_single_threaded == '\0') {
                      LOCK();
                      p_Var8->_M_use_count = p_Var8->_M_use_count + 1;
                      UNLOCK();
                    }
                    else {
                      p_Var8->_M_use_count = p_Var8->_M_use_count + 1;
                    }
                    *(undefined1 *)(lVar7 + 0xe0) = 0;
                    if (p_Var8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var8);
                    }
                  }
                }
                std::
                vector<std::shared_ptr<Component>,_std::allocator<std::shared_ptr<Component>_>_>::
                resize(&this->m_partHighlighted,0);
                std::vector<std::shared_ptr<Pin>,_std::allocator<std::shared_ptr<Pin>_>_>::resize
                          (&this->m_pinHighlighted,0);
              }
              peVar9 = (this->m_pinSelected).super___shared_ptr<Pin,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr;
              ((peVar9->component).super___shared_ptr<Component,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
              ->visualmode = '\x01';
              std::vector<std::shared_ptr<Component>,_std::allocator<std::shared_ptr<Component>_>_>
              ::push_back(&this->m_partHighlighted,&peVar9->component);
            }
            if ((this->m_pinSelected).super___shared_ptr<Pin,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
                (element_type *)0x0) {
              iVar22 = (*this->m_board->_vptr_Board[3])();
              __x = *(shared_ptr<Component> **)CONCAT44(extraout_var_01,iVar22);
              psVar21 = (shared_ptr<Component> *)((long *)CONCAT44(extraout_var_01,iVar22))[1];
              if (__x != psVar21) {
                local_98._4_4_ = local_68._4_4_;
                local_98._0_4_ = local_68._4_4_;
                uStack_90 = local_68._4_4_;
                uStack_8c = local_68._4_4_;
                this_02 = &this->m_partHighlighted;
                local_50 = &this->m_pinHighlighted;
                local_88 = 0;
                local_48 = this_02;
                local_40 = psVar21;
                do {
                  peVar10 = (__x->super___shared_ptr<Component,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
                  p_Var8 = (__x->super___shared_ptr<Component,_(__gnu_cxx::_Lock_policy)2>).
                           _M_refcount._M_pi;
                  if (p_Var8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                    if (__libc_single_threaded == '\0') {
                      LOCK();
                      p_Var8->_M_use_count = p_Var8->_M_use_count + 1;
                      UNLOCK();
                    }
                    else {
                      p_Var8->_M_use_count = p_Var8->_M_use_count + 1;
                    }
                  }
                  if (peVar10 == (element_type *)0x0) {
                    bVar14 = true;
                  }
                  else {
                    EVar5 = (peVar10->super_BoardElement).board_side;
                    bVar14 = EVar5 == kBoardSideBoth || EVar5 == this->m_current_side;
                  }
                  if (p_Var8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var8);
                  }
                  if (bVar14) {
                    peVar10 = (__x->super___shared_ptr<Component,_(__gnu_cxx::_Lock_policy)2>).
                              _M_ptr;
                    local_a8._M_allocated_capacity._0_4_ = (peVar10->outline)._M_elems[2].x;
                    local_a8._M_allocated_capacity._4_4_ = (peVar10->outline)._M_elems[2].y;
                    local_a8._8_4_ = (peVar10->outline)._M_elems[3].x;
                    local_a8._12_4_ = (peVar10->outline)._M_elems[3].y;
                    _local_b8 = (peVar10->outline)._M_elems[0];
                    IStack_b0 = (peVar10->outline)._M_elems[1];
                    bVar14 = false;
                    lVar7 = 0;
                    lVar19 = 3;
                    do {
                      lVar16 = lVar7;
                      fVar25 = *(float *)(local_b8 + lVar16 * 8 + 4);
                      if (((float)local_98._0_4_ < fVar25 ==
                           *(float *)(local_b8 + lVar19 * 8 + 4) <= (float)local_98._0_4_) &&
                         ((float)local_68._0_4_ <
                          (((float)local_98._0_4_ - fVar25) *
                          (*(float *)(local_b8 + lVar19 * 8) - *(float *)(local_b8 + lVar16 * 8))) /
                          (*(float *)(local_b8 + lVar19 * 8 + 4) - fVar25) +
                          *(float *)(local_b8 + lVar16 * 8))) {
                        bVar14 = (bool)(bVar14 ^ 1);
                      }
                      lVar7 = lVar16 + 1;
                      lVar19 = lVar16;
                    } while (lVar16 + 1 != 4);
                    if (bVar14) {
                      _Var17 = std::
                               __find_if<__gnu_cxx::__normal_iterator<std::shared_ptr<Component>*,std::vector<std::shared_ptr<Component>,std::allocator<std::shared_ptr<Component>>>>,__gnu_cxx::__ops::_Iter_equals_val<std::shared_ptr<Component>const>>
                                         ((this->m_partHighlighted).
                                          super__Vector_base<std::shared_ptr<Component>,_std::allocator<std::shared_ptr<Component>_>_>
                                          ._M_impl.super__Vector_impl_data._M_start,
                                          (this->m_partHighlighted).
                                          super__Vector_base<std::shared_ptr<Component>,_std::allocator<std::shared_ptr<Component>_>_>
                                          ._M_impl.super__Vector_impl_data._M_finish,__x);
                      psVar11 = (this->m_partHighlighted).
                                super__Vector_base<std::shared_ptr<Component>,_std::allocator<std::shared_ptr<Component>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish;
                      if (pIVar15->KeyCtrl == true) {
                        if (_Var17._M_current == psVar11) {
LAB_0011958e:
                          uVar20 = '\x01';
                          std::
                          vector<std::shared_ptr<Component>,_std::allocator<std::shared_ptr<Component>_>_>
                          ::push_back(this_02,__x);
                        }
                        else {
                          remove<std::shared_ptr<Component>>(__x,this_02);
                          uVar20 = '\0';
                        }
                        peVar10 = (__x->super___shared_ptr<Component,_(__gnu_cxx::_Lock_policy)2>).
                                  _M_ptr;
                        peVar10->visualmode = uVar20;
                        local_88 = CONCAT71((int7)((ulong)peVar10 >> 8),1);
                      }
                      else {
                        local_38 = psVar11;
                        iVar22 = (*this->m_board->_vptr_Board[3])();
                        plVar6 = (long *)((undefined8 *)CONCAT44(extraout_var_02,iVar22))[1];
                        for (plVar18 = *(long **)CONCAT44(extraout_var_02,iVar22);
                            this_02 = local_48, plVar18 != plVar6; plVar18 = plVar18 + 2) {
                          lVar7 = *plVar18;
                          p_Var8 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)plVar18[1];
                          if (p_Var8 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                            *(undefined1 *)(lVar7 + 0xe0) = 0;
                          }
                          else {
                            if (__libc_single_threaded == '\0') {
                              LOCK();
                              p_Var8->_M_use_count = p_Var8->_M_use_count + 1;
                              UNLOCK();
                            }
                            else {
                              p_Var8->_M_use_count = p_Var8->_M_use_count + 1;
                            }
                            *(undefined1 *)(lVar7 + 0xe0) = 0;
                            if (p_Var8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var8);
                            }
                          }
                        }
                        std::
                        vector<std::shared_ptr<Component>,_std::allocator<std::shared_ptr<Component>_>_>
                        ::resize(local_48,0);
                        psVar21 = local_40;
                        std::vector<std::shared_ptr<Pin>,_std::allocator<std::shared_ptr<Pin>_>_>::
                        resize(local_50,0);
                        local_88 = CONCAT71((int7)((ulong)extraout_RAX >> 8),1);
                        if (_Var17._M_current == local_38) goto LAB_0011958e;
                      }
                    }
                  }
                  __x = __x + 1;
                } while (__x != psVar21);
                if ((local_88 & 1) != 0) goto LAB_00118fcb;
              }
              if (pIVar15->KeyCtrl == false) {
                iVar22 = (*this->m_board->_vptr_Board[3])();
                plVar6 = (long *)((undefined8 *)CONCAT44(extraout_var_03,iVar22))[1];
                for (plVar18 = *(long **)CONCAT44(extraout_var_03,iVar22); plVar18 != plVar6;
                    plVar18 = plVar18 + 2) {
                  *(undefined1 *)(*plVar18 + 0xe0) = 0;
                }
                std::
                vector<std::shared_ptr<Component>,_std::allocator<std::shared_ptr<Component>_>_>::
                clear(&this->m_partHighlighted);
              }
            }
LAB_00118fcb:
            if (_Stack_70._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_70._M_pi);
            }
          }
          else if (this->m_showContextMenu == false) {
            iVar22 = AnnotationIsHovered(this);
            if (iVar22 == 0) {
              this->AnnotationWasHovered = false;
              this->m_needsRedraw = true;
            }
            else {
              this->m_needsRedraw = true;
              this->AnnotationWasHovered = true;
            }
          }
        }
        else if ((this->config).showAnnotations == true) {
          IVar12 = ImGui::GetMousePos();
          uStack_90 = extraout_XMM0_Dc_00;
          local_98._0_4_ = IVar12.x;
          local_98._4_4_ = IVar12.y;
          uStack_8c = extraout_XMM0_Dd_00;
          this_01 = this;
          iVar22 = AnnotationIsHovered(this);
          auVar13 = _local_98;
          if (iVar22 != 0) {
            this->m_annotation_clicked_id = this->m_annotation_last_hovered;
          }
          this->m_annotationedit_retain = false;
          this->m_showContextMenu = true;
          (this->m_showContextMenuPos).x = (float)local_98._0_4_;
          (this->m_showContextMenuPos).y = (float)local_98._4_4_;
          this->m_needsRedraw = true;
          _local_98 = auVar13;
          if (this->debug == true) {
            HandleInput(this_01);
          }
        }
        this->m_draggingLastFrame = false;
      }
      fVar25 = pIVar15->MouseWheel;
      if ((fVar25 != 0.0) || (NAN(fVar25))) {
        Zoom(this,(pIVar15->MousePos).x,(pIVar15->MousePos).y,fVar25 * (this->config).zoomFactor);
      }
    }
  }
  if (pIVar15->WantCaptureKeyboard != false) {
    return;
  }
  _local_b8 = (ImVec2)&local_a8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_b8,"Mirror","");
  this_00 = &this->keybindings;
  bVar14 = KeyBindings::isPressed(this_00,(string *)local_b8);
  if (_local_b8 != (ImVec2)&local_a8) {
    operator_delete((void *)_local_b8,local_a8._M_allocated_capacity + 1);
  }
  if (bVar14) {
    Mirror(this);
    CenterView(this);
LAB_00119082:
    this->m_needsRedraw = true;
  }
  else {
    _local_b8 = (ImVec2)&local_a8;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_b8,"RotateCW","");
    bVar14 = KeyBindings::isPressed(this_00,(string *)local_b8);
    if (_local_b8 != (ImVec2)&local_a8) {
      operator_delete((void *)_local_b8,local_a8._M_allocated_capacity + 1);
    }
    if (bVar14) {
      iVar22 = 1;
    }
    else {
      _local_b8 = (ImVec2)&local_a8;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_b8,"RotateCCW","");
      bVar14 = KeyBindings::isPressed(this_00,(string *)local_b8);
      if (_local_b8 != (ImVec2)&local_a8) {
        operator_delete((void *)_local_b8,local_a8._M_allocated_capacity + 1);
      }
      if (!bVar14) {
        _local_b8 = (ImVec2)&local_a8;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_b8,"ZoomIn","");
        bVar14 = KeyBindings::isPressed(this_00,(string *)local_b8);
        if (_local_b8 != (ImVec2)&local_a8) {
          operator_delete((void *)_local_b8,local_a8._M_allocated_capacity + 1);
        }
        if (bVar14) {
          fVar24 = (this->m_board_surface).x;
          fVar2 = (this->m_board_surface).y;
          fVar25 = (this->config).zoomFactor;
LAB_0011920c:
          Zoom(this,fVar24 * 0.5,fVar2 * 0.5,fVar25);
          return;
        }
        _local_b8 = (ImVec2)&local_a8;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_b8,"ZoomOut","");
        bVar14 = KeyBindings::isPressed(this_00,(string *)local_b8);
        if (_local_b8 != (ImVec2)&local_a8) {
          operator_delete((void *)_local_b8,local_a8._M_allocated_capacity + 1);
        }
        if (bVar14) {
          fVar24 = (this->m_board_surface).x;
          fVar2 = (this->m_board_surface).y;
          fVar25 = -(this->config).zoomFactor;
          goto LAB_0011920c;
        }
        _local_b8 = (ImVec2)&local_a8;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_b8,"PanDown","");
        bVar14 = KeyBindings::isPressed(this_00,(string *)local_b8);
        if (_local_b8 != (ImVec2)&local_a8) {
          operator_delete((void *)_local_b8,local_a8._M_allocated_capacity + 1);
        }
        if (bVar14) {
          iVar22 = DPI((this->config).panFactor);
          iVar23 = 2;
LAB_00119379:
          Pan(this,iVar23,iVar22);
          return;
        }
        _local_b8 = (ImVec2)&local_a8;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_b8,"PanUp","");
        bVar14 = KeyBindings::isPressed(this_00,(string *)local_b8);
        if (_local_b8 != (ImVec2)&local_a8) {
          operator_delete((void *)_local_b8,local_a8._M_allocated_capacity + 1);
        }
        if (bVar14) {
          iVar22 = DPI((this->config).panFactor);
          iVar23 = 1;
          goto LAB_00119379;
        }
        _local_b8 = (ImVec2)&local_a8;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_b8,"PanLeft","");
        bVar14 = KeyBindings::isPressed(this_00,(string *)local_b8);
        if (_local_b8 != (ImVec2)&local_a8) {
          operator_delete((void *)_local_b8,local_a8._M_allocated_capacity + 1);
        }
        if (bVar14) {
          iVar22 = DPI((this->config).panFactor);
          iVar23 = 3;
          goto LAB_00119379;
        }
        _local_b8 = (ImVec2)&local_a8;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_b8,"PanRight","");
        bVar14 = KeyBindings::isPressed(this_00,(string *)local_b8);
        if (_local_b8 != (ImVec2)&local_a8) {
          operator_delete((void *)_local_b8,local_a8._M_allocated_capacity + 1);
        }
        if (bVar14) {
          iVar22 = DPI((this->config).panFactor);
          iVar23 = 4;
          goto LAB_00119379;
        }
        _local_b8 = (ImVec2)&local_a8;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_b8,"Center","");
        bVar14 = KeyBindings::isPressed(this_00,(string *)local_b8);
        if (_local_b8 != (ImVec2)&local_a8) {
          operator_delete((void *)_local_b8,local_a8._M_allocated_capacity + 1);
        }
        if (bVar14) {
          CenterView(this);
          return;
        }
        _local_b8 = (ImVec2)&local_a8;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_b8,"Quit","");
        bVar14 = KeyBindings::isPressed(this_00,(string *)local_b8);
        if (_local_b8 != (ImVec2)&local_a8) {
          operator_delete((void *)_local_b8,local_a8._M_allocated_capacity + 1);
        }
        if (bVar14) {
          this->m_wantsQuit = true;
          return;
        }
        _local_b8 = (ImVec2)&local_a8;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_b8,"InfoPanel","");
        bVar14 = KeyBindings::isPressed(this_00,(string *)local_b8);
        if (_local_b8 != (ImVec2)&local_a8) {
          operator_delete((void *)_local_b8,local_a8._M_allocated_capacity + 1);
        }
        if (bVar14) {
          bVar14 = (bool)((this->config).showInfoPanel ^ 1);
          (this->config).showInfoPanel = bVar14;
          Confparse::WriteBool(&this->obvconfig,"showInfoPanel",bVar14);
          return;
        }
        _local_b8 = (ImVec2)&local_a8;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_b8,"NetList","");
        bVar14 = KeyBindings::isPressed(this_00,(string *)local_b8);
        if (_local_b8 != (ImVec2)&local_a8) {
          operator_delete((void *)_local_b8,local_a8._M_allocated_capacity + 1);
        }
        if (bVar14) {
          this->m_showNetList = (bool)(this->m_showNetList ^ 1);
          return;
        }
        _local_b8 = (ImVec2)&local_a8;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_b8,"PartList","");
        bVar14 = KeyBindings::isPressed(this_00,(string *)local_b8);
        if (_local_b8 != (ImVec2)&local_a8) {
          operator_delete((void *)_local_b8,local_a8._M_allocated_capacity + 1);
        }
        if (bVar14) {
          this->m_showPartList = (bool)(this->m_showPartList ^ 1);
          return;
        }
        _local_b8 = (ImVec2)&local_a8;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_b8,"Flip","");
        bVar14 = KeyBindings::isPressed(this_00,(string *)local_b8);
        if (_local_b8 != (ImVec2)&local_a8) {
          operator_delete((void *)_local_b8,local_a8._M_allocated_capacity + 1);
        }
        if (bVar14) {
          FlipBoard(this,0);
          return;
        }
        _local_b8 = (ImVec2)&local_a8;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_b8,"TogglePins","");
        bVar14 = KeyBindings::isPressed(this_00,(string *)local_b8);
        if (_local_b8 != (ImVec2)&local_a8) {
          operator_delete((void *)_local_b8,local_a8._M_allocated_capacity + 1);
        }
        if (!bVar14) {
          _local_b8 = (ImVec2)&local_a8;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_b8,"Search","");
          bVar14 = KeyBindings::isPressed(this_00,(string *)local_b8);
          if (_local_b8 != (ImVec2)&local_a8) {
            operator_delete((void *)_local_b8,local_a8._M_allocated_capacity + 1);
          }
          if (bVar14) {
            if (this->m_validBoard != true) {
              return;
            }
            this->m_showSearch = true;
            this->m_needsRedraw = true;
            return;
          }
          _local_b8 = (ImVec2)&local_a8;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_b8,"Clear","");
          bVar14 = KeyBindings::isPressed(this_00,(string *)local_b8);
          if (_local_b8 != (ImVec2)&local_a8) {
            operator_delete((void *)_local_b8,local_a8._M_allocated_capacity + 1);
          }
          if (!bVar14) {
            return;
          }
          ClearAllHighlights(this);
          return;
        }
        pbVar1 = &(this->config).showPins;
        *pbVar1 = (bool)(*pbVar1 ^ 1);
        goto LAB_00119082;
      }
      iVar22 = -1;
    }
    Rotate(this,iVar22);
  }
  return;
}

Assistant:

void BoardView::HandleInput() {
	if (!m_board || (!m_file)) return;

	const ImGuiIO &io = ImGui::GetIO();

	if (ImGui::IsWindowHovered()) {
		if (!ImGui::IsWindowFocused()) {
			// Set focus on boardview area hover to apply our key bindings instead of the currently active ImGui's keyboard navigation
			// Using imgui_internal's FocusWindow with UnlessBelowModal instead of SetWindowFocus
			// Otherwise PopupModal get closed right after opening when boardview area is hovered
			// https://github.com/ocornut/imgui/issues/3595
			// Warning: wouldn't work with regular Popup but we use only PopupModal
			ImGui::FocusWindow(nullptr, ImGuiFocusRequestFlags_UnlessBelowModal);
		}

		if (ImGui::IsMouseDragging(0)) {
			if ((m_dragging_token == 0) && (io.MouseClickedPos[0].x < m_board_surface.x)) m_dragging_token = 1; // own it.
			if (m_dragging_token == 1) {
				//		   if ((io.MouseClickedPos[0].x < m_info_surface.x)) {
				ImVec2 delta = ImGui::GetMouseDragDelta();
				if ((abs(delta.x) > 500) || (abs(delta.y) > 500)) {
					delta.x = 0;
					delta.y = 0;
				} // If the delta values are crazy just drop them (happens when panning
				// off screen). 500 arbritary chosen
				ImGui::ResetMouseDragDelta();
				ImVec2 td = ScreenToCoord(delta.x, delta.y, 0);
				m_dx += td.x;
				m_dy += td.y;
				m_draggingLastFrame = true;
				m_needsRedraw       = true;
			}
		} else if (m_dragging_token >= 0) {
			m_dragging_token = 0;

			if (m_lastFileOpenWasInvalid == false) {
				// Conext menu
				if (!m_lastFileOpenWasInvalid && m_file && m_board && ImGui::IsMouseClicked(1)) {
					if (config.showAnnotations) {
						// Build context menu here, for annotations and inspection
						//
						ImVec2 spos = ImGui::GetMousePos();
						if (AnnotationIsHovered()) m_annotation_clicked_id = m_annotation_last_hovered;

						m_annotationedit_retain = false;
						m_showContextMenu       = true;
						m_showContextMenuPos    = spos;
						m_needsRedraw           = true;
						if (debug) fprintf(stderr, "context click request at (%f %f)\n", spos.x, spos.y);
					}

					// Flip the board with the middle click
				} else if (!m_lastFileOpenWasInvalid && m_file && m_board && ImGui::IsMouseReleased(2)) {
					FlipBoard();

					// Else, click to select pin
				} else if (!m_lastFileOpenWasInvalid && m_file && m_board && ImGui::IsMouseReleased(0) && !m_draggingLastFrame) {
					ImVec2 spos = ImGui::GetMousePos();
					ImVec2 pos  = ScreenToCoord(spos.x, spos.y);

					m_needsRedraw = true;

					// threshold to within a pin's diameter of the pin center
					// float min_dist = m_pinDiameter * 1.0f;
					float min_dist = m_pinDiameter / 2.0f;
					min_dist *= min_dist; // all distance squared
					std::shared_ptr<Pin> selection = nullptr;
					for (auto &pin : m_board->Pins()) {
						if (BoardElementIsVisible(pin)) {
							float dx   = pin->position.x - pos.x;
							float dy   = pin->position.y - pos.y;
							float dist = dx * dx + dy * dy;
							if ((dist < (pin->diameter * pin->diameter)) && (dist < min_dist)) {
								selection = pin;
								min_dist  = dist;
							}
						}
					}

					m_pinSelected = selection;
					if (m_pinSelected) {
						if (!io.KeyCtrl) {
							for (auto p : m_board->Components()) {
								p->visualmode = p->CVMNormal;
							}
							m_partHighlighted.resize(0);
							m_pinHighlighted.resize(0);
						}
						m_pinSelected->component->visualmode = m_pinSelected->component->CVMSelected;
						m_partHighlighted.push_back(m_pinSelected->component);
					}

					if (m_pinSelected == nullptr) {
						bool any_hits = false;

						for (auto &part : m_board->Components()) {
							int hit = 0;
							//							auto p_part = part.get();

							if (!BoardElementIsVisible(part)) continue;

							// Work out if the point is inside the hull
							{
								auto poly = part->outline;

								for (size_t i = 0, j = poly.size() - 1; i < poly.size(); j = i++) {
									if (((poly[i].y > pos.y) != (poly[j].y > pos.y)) &&
									    (pos.x <
									     (poly[j].x - poly[i].x) * (pos.y - poly[i].y) / (poly[j].y - poly[i].y) + poly[i].x))
										hit ^= 1;
								}
							}

							if (hit) {
								any_hits = true;

								bool partInList = contains(part, m_partHighlighted);

								/*
								 * If the CTRL key isn't held down, then we have to
								 * flush any existing highlighted parts
								 */
								if (io.KeyCtrl) {
									if (!partInList) {
										m_partHighlighted.push_back(part);
										part->visualmode = part->CVMSelected;
									} else {
										remove(part, m_partHighlighted);
										part->visualmode = part->CVMNormal;
									}

								} else {
									for (auto p : m_board->Components()) {
										p->visualmode = p->CVMNormal;
									}
									m_partHighlighted.resize(0);
									m_pinHighlighted.resize(0);
									if (!partInList) {
										m_partHighlighted.push_back(part);
										part->visualmode = part->CVMSelected;
									}
								}

								/*
								 * If this part has a non-selected visual mode (normal)
								 * AND it's not in the existing part list, then add it
								 */
								/*
								if (part->visualmode == part->CVMNormal) {
								    if (!partInList) {
								        m_partHighlighted.push_back(p_part);
								    }
								}

								part->visualmode++;
								part->visualmode %= part->CVMModeCount;

								if (part->visualmode == part->CVMNormal) {
								    remove(*part, m_partHighlighted);
								}
								*/
							} // if hit
						}     // for each part on the board

						/*
						 * If we aren't holding down CTRL and we click to a
						 * non pin, non part area, then we clear everything
						 */
						if ((!any_hits) && (!io.KeyCtrl)) {
							for (auto &part : m_board->Components()) {
								//								auto p        = part.get();
								part->visualmode = part->CVMNormal;
							}
							m_partHighlighted.clear();
						}

					} // if a pin wasn't selected

				} else {
					if (!m_showContextMenu) {
						if (AnnotationIsHovered()) {
							m_needsRedraw        = true;
							AnnotationWasHovered = true;
						} else {
							AnnotationWasHovered = false;
							m_needsRedraw        = true;
						}
					}
				}

				m_draggingLastFrame = false;
			}

			// Zoom:
			float mwheel = io.MouseWheel;
			if (mwheel != 0.0f) {
				mwheel *= config.zoomFactor;

				Zoom(io.MousePos.x, io.MousePos.y, mwheel);
			}
		}
	}

	if ((!io.WantCaptureKeyboard)) {

		if (keybindings.isPressed("Mirror")) {
			Mirror();
			CenterView();
			m_needsRedraw = true;

		} else if (keybindings.isPressed("RotateCW")) {
			// Rotate board: R and period rotate clockwise; comma rotates
			// counter-clockwise
			Rotate(1);

		} else if (keybindings.isPressed("RotateCCW")) {
			Rotate(-1);

		} else if (keybindings.isPressed("ZoomIn")) {
			Zoom(m_board_surface.x / 2, m_board_surface.y / 2, config.zoomFactor);

		} else if (keybindings.isPressed("ZoomOut")) {
			Zoom(m_board_surface.x / 2, m_board_surface.y / 2, -config.zoomFactor);

		} else if (keybindings.isPressed("PanDown")) {
			Pan(DIR_DOWN, DPI(config.panFactor));

		} else if (keybindings.isPressed("PanUp")) {
			Pan(DIR_UP, DPI(config.panFactor));

		} else if (keybindings.isPressed("PanLeft")) {
			Pan(DIR_LEFT, DPI(config.panFactor));

		} else if (keybindings.isPressed("PanRight")) {
			Pan(DIR_RIGHT, DPI(config.panFactor));

		} else if (keybindings.isPressed("Center")) {
			// Center and reset zoom
			CenterView();

		} else if (keybindings.isPressed("Quit")) {
			// quit OFBV
			m_wantsQuit = true;

		} else if (keybindings.isPressed("InfoPanel")) {
			config.showInfoPanel = !config.showInfoPanel;
			obvconfig.WriteBool("showInfoPanel", config.showInfoPanel ? true : false);

		} else if (keybindings.isPressed("NetList")) {
			// Show Net List
			m_showNetList = m_showNetList ? false : true;

		} else if (keybindings.isPressed("PartList")) {
			// Show Part List
			m_showPartList = m_showPartList ? false : true;

		} else if (keybindings.isPressed("Flip")) {
			// Flip board:
			FlipBoard();

		} else if (keybindings.isPressed("TogglePins")) {
			config.showPins ^= 1;
			m_needsRedraw = true;

		} else if (keybindings.isPressed("Search")) {
			if (m_validBoard) {
				m_showSearch  = true;
				m_needsRedraw = true;
			}

		} else if (keybindings.isPressed("Clear")) {
			ClearAllHighlights();

		} else {
			/*
			 * Do what ever is required for unhandled key presses.
			 */
		}
	}
}